

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraKateGenerator::AppendTarget
          (cmExtraKateGenerator *this,cmGeneratedFileStream *fout,string *target,string *make,
          string *makeArgs,string *path,string *homeOutputDir)

{
  char cVar1;
  ostream *poVar2;
  
  poVar2 = std::operator<<((ostream *)fout,"\t\t\t");
  cVar1 = ' ';
  if (AppendTarget(cmGeneratedFileStream&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
      ::JsonSep != '\0') {
    cVar1 = ',';
  }
  poVar2 = std::operator<<(poVar2,cVar1);
  poVar2 = std::operator<<(poVar2,"{\"name\":\"");
  poVar2 = std::operator<<(poVar2,(string *)target);
  poVar2 = std::operator<<(poVar2,"\", \"build_cmd\":\"");
  poVar2 = std::operator<<(poVar2,(string *)make);
  poVar2 = std::operator<<(poVar2," -C \\\"");
  if (this->UseNinja != false) {
    path = homeOutputDir;
  }
  poVar2 = std::operator<<(poVar2,(string *)path);
  poVar2 = std::operator<<(poVar2,"\\\" ");
  poVar2 = std::operator<<(poVar2,(string *)makeArgs);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,(string *)target);
  std::operator<<(poVar2,"\"}\n");
  AppendTarget(cmGeneratedFileStream&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
  ::JsonSep = 1;
  return;
}

Assistant:

void cmExtraKateGenerator::AppendTarget(cmGeneratedFileStream& fout,
                                        const std::string& target,
                                        const std::string& make,
                                        const std::string& makeArgs,
                                        const std::string& path,
                                        const std::string& homeOutputDir) const
{
  static char JsonSep = ' ';

  fout << "\t\t\t" << JsonSep << "{\"name\":\"" << target
       << "\", "
          "\"build_cmd\":\""
       << make << " -C \\\"" << (this->UseNinja ? homeOutputDir : path)
       << "\\\" " << makeArgs << " " << target << "\"}\n";

  JsonSep = ',';
}